

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O2

int Abc_NtkEliminate1One(Abc_Ntk_t *pNtk,int ElimValue,int nMaxSize,int fReverse,int fVerbose)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p;
  int *pPermFanin;
  int *pPermFanout;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pAVar4;
  long lVar5;
  
  if (nMaxSize < 1) {
    __assert_fail("nMaxSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                  ,0x260,"int Abc_NtkEliminate1One(Abc_Ntk_t *, int, int, int, int)");
  }
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                  ,0x261,"int Abc_NtkEliminate1One(Abc_Ntk_t *, int, int, int, int)");
  }
  iVar1 = Abc_NtkToAig(pNtk);
  if (iVar1 == 0) {
    fwrite("Converting to AIG has failed.\n",0x1e,1,_stdout);
    iVar1 = 0;
  }
  else {
    if (fReverse == 0) {
      p = Abc_NtkDfs(pNtk,0);
    }
    else {
      p = Abc_NtkDfsReverse(pNtk);
    }
    __size = (ulong)(uint)nMaxSize * 4 + 4000;
    pPermFanin = (int *)malloc(__size);
    pPermFanout = (int *)malloc(__size);
    p_00 = Vec_PtrAlloc(1000);
    p_01 = Vec_PtrAlloc(1000);
    for (iVar1 = 0; iVar1 < p->nSize; iVar1 = iVar1 + 1) {
      pNode = (Abc_Obj_t *)Vec_PtrEntry(p,iVar1);
      if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
        pAVar4 = Abc_NodeFindCoFanout(pNode);
        if ((pAVar4 == (Abc_Obj_t *)0x0) && ((pNode->vFanins).nSize <= nMaxSize)) {
          iVar2 = Abc_NodeIsExor(pNode);
          if (iVar2 == 0) {
            iVar2 = Abc_NodeCountAppearancesAll(pNode);
            if (iVar2 <= ElimValue + 2) {
              for (lVar5 = 0; iVar2 = (pNode->vFanouts).nSize, lVar5 < iVar2; lVar5 = lVar5 + 1) {
                iVar2 = Abc_NodeCollapseSuppSize
                                  (pNode,(Abc_Obj_t *)
                                         pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar5]]
                                   ,p_00);
                if (nMaxSize < iVar2) {
                  iVar2 = (pNode->vFanouts).nSize;
                  break;
                }
              }
              if (iVar2 <= (int)lVar5) {
                Abc_NodeCollectFanouts(pNode,p_01);
                for (iVar2 = 0; iVar2 < p_01->nSize; iVar2 = iVar2 + 1) {
                  pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p_01,iVar2);
                  if (fVerbose != 0) {
                    printf("Collapsing fanin %5d (supp =%2d) into fanout %5d (supp =%2d) ",
                           (ulong)(uint)pNode->Id,(ulong)(uint)(pNode->vFanins).nSize,
                           (ulong)(uint)pAVar4->Id,(ulong)(uint)(pAVar4->vFanins).nSize);
                  }
                  iVar3 = Abc_NodeCollapse1(pNode,pAVar4,p_00,pPermFanin,pPermFanout);
                  if (iVar3 == 0) {
                    __assert_fail("RetValue",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                                  ,0x28c,"int Abc_NtkEliminate1One(Abc_Ntk_t *, int, int, int, int)"
                                 );
                  }
                  if (fVerbose != 0) {
                    pAVar4 = Abc_NtkObj(pNtk,pNtk->vObjs->nSize + -1);
                    if (pAVar4 != (Abc_Obj_t *)0x0) {
                      printf("resulting in node %5d (supp =%2d).\n",(ulong)(uint)pAVar4->Id,
                             (ulong)(uint)(pAVar4->vFanins).nSize);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    Vec_PtrFree(p_00);
    Vec_PtrFree(p_01);
    Vec_PtrFree(p);
    free(pPermFanin);
    free(pPermFanout);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_NtkEliminate1One( Abc_Ntk_t * pNtk, int ElimValue, int nMaxSize, int fReverse, int fVerbose )
{
    Vec_Ptr_t * vFanouts, * vFanins, * vNodes;
    Abc_Obj_t * pNode, * pFanout;
    int * pPermFanin, * pPermFanout;
    int RetValue, i, k;
    assert( nMaxSize > 0 );
    assert( Abc_NtkIsLogic(pNtk) ); 
    // convert network to BDD representation
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to AIG has failed.\n" );
        return 0;
    }
    // get the nodes in the given order
    vNodes = fReverse? Abc_NtkDfsReverse( pNtk ) : Abc_NtkDfs( pNtk, 0 );
    // go through the nodes and decide is they can be eliminated
    pPermFanin = ABC_ALLOC( int, nMaxSize + 1000 );
    pPermFanout = ABC_ALLOC( int, nMaxSize + 1000 );
    vFanins = Vec_PtrAlloc( 1000 );
    vFanouts = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( !Abc_ObjIsNode(pNode) ) // skip deleted nodes
            continue;
        if ( Abc_NodeFindCoFanout(pNode) != NULL )
            continue;
        if ( Abc_ObjFaninNum(pNode) > nMaxSize )
            continue;
        if ( Abc_NodeIsExor(pNode) )
            continue;
        // skip nodes with more than one fanout
//        if ( Abc_ObjFanoutNum(pNode) != 1 ) 
//            continue;
        // skip nodes that appear in the FF of their fanout more than once
        if ( Abc_NodeCountAppearancesAll( pNode ) > ElimValue + 2 ) 
            continue;       
        Abc_ObjForEachFanout( pNode, pFanout, k )
            if ( Abc_NodeCollapseSuppSize(pNode, pFanout, vFanins) > nMaxSize )
                break;
        if ( k < Abc_ObjFanoutNum(pNode) )
            continue;
        // perform elimination
        Abc_NodeCollectFanouts( pNode, vFanouts );
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, k )
        {
            if ( fVerbose )
                printf( "Collapsing fanin %5d (supp =%2d) into fanout %5d (supp =%2d) ",
                    Abc_ObjId(pNode), Abc_ObjFaninNum(pNode), Abc_ObjId(pFanout), Abc_ObjFaninNum(pFanout) ); 
            RetValue = Abc_NodeCollapse1( pNode, pFanout, vFanins, pPermFanin, pPermFanout );
            assert( RetValue );
            if ( fVerbose )
            {
                Abc_Obj_t * pNodeNew = Abc_NtkObj( pNtk, Abc_NtkObjNumMax(pNtk) - 1 );
                if ( pNodeNew )
                    printf( "resulting in node %5d (supp =%2d).\n", Abc_ObjId(pNodeNew), Abc_ObjFaninNum(pNodeNew) );
            }
        }
    }
    Vec_PtrFree( vFanins );
    Vec_PtrFree( vFanouts );
    Vec_PtrFree( vNodes );
    ABC_FREE( pPermFanin );
    ABC_FREE( pPermFanout );
    return 1;
}